

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O3

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
::
query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
          (rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
           *this,size_t node_idx,query_intersects_box<perior::point<double,_2UL>_> *q,
          back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
          out)

{
  point_type *ppVar1;
  value_type *__x;
  double dVar2;
  long lVar3;
  ulong node_idx_00;
  bool bVar4;
  bool bVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  const_iterator e;
  ulong *puVar9;
  long lVar10;
  ulong *puVar11;
  double dVar12;
  double local_78;
  double local_70;
  back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  local_68;
  ulong *local_60;
  query_intersects_box<perior::point<double,_2UL>_> local_58;
  
  local_68.container = out.container;
  if (*(ulong *)(this + 0x58) <= node_idx) {
LAB_0010b81d:
    boost::container::throw_out_of_range("vector::at out of range");
  }
  lVar10 = *(long *)(this + 0x50);
  lVar7 = node_idx * 0x68;
  lVar8 = lVar10 + lVar7;
  lVar3 = *(long *)(lVar10 + 0x40 + lVar7);
  puVar9 = (ulong *)(lVar3 * 8 + 0x10 + lVar8);
  if (*(char *)(lVar10 + lVar7) == '\x01') {
    if (lVar3 != 0) {
      puVar11 = (ulong *)(lVar8 + 0x10);
      do {
        if (*(ulong *)(this + 0x70) <= *puVar11) goto LAB_0010b81d;
        __x = (value_type *)(*(long *)(this + 0x68) + *puVar11 * 0x28);
        local_70 = (__x->first).center.values_.elems[0] - (q->rect).center.values_.elems[0];
        local_78 = (__x->first).center.values_.elems[1] - (q->rect).center.values_.elems[1];
        lVar8 = 0;
        pdVar6 = &local_70;
        bVar5 = true;
        do {
          bVar4 = bVar5;
          dVar2 = *pdVar6;
          if (-*(double *)(this + lVar8 * 8 + 0x40) <= dVar2) {
            if (*(double *)(this + lVar8 * 8 + 0x40) <= dVar2) {
              dVar2 = dVar2 - *(double *)(this + lVar8 * 8 + 0x30);
              goto LAB_0010b659;
            }
          }
          else {
            dVar2 = dVar2 + *(double *)(this + lVar8 * 8 + 0x30);
LAB_0010b659:
            *pdVar6 = dVar2;
          }
          lVar8 = 1;
          pdVar6 = &local_78;
          bVar5 = false;
        } while (bVar4);
        bVar5 = true;
        lVar8 = 0;
        pdVar6 = &local_70;
        do {
          dVar2 = *pdVar6;
          dVar12 = (__x->first).radius.values_.elems[lVar8] + (q->rect).radius.values_.elems[lVar8];
          if (!bVar5) break;
          lVar8 = 1;
          bVar5 = false;
          pdVar6 = &local_78;
        } while (ABS(dVar2) <= dVar12);
        if (ABS(dVar2) <= dVar12) {
          std::
          vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
          ::push_back(local_68.container,__x);
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar9);
    }
  }
  else if (lVar3 != 0) {
    puVar11 = (ulong *)(lVar8 + 0x10);
    ppVar1 = &(q->rect).radius;
    local_60 = puVar9;
    do {
      node_idx_00 = *puVar11;
      if (*(ulong *)(this + 0x58) <= node_idx_00) goto LAB_0010b81d;
      lVar8 = *(long *)(this + 0x50) + node_idx_00 * 0x68;
      local_70 = (q->rect).center.values_.elems[0] - *(double *)(lVar8 + 0x48);
      local_78 = (q->rect).center.values_.elems[1] - *(double *)(lVar8 + 0x50);
      lVar10 = 0;
      pdVar6 = &local_70;
      bVar5 = true;
      do {
        bVar4 = bVar5;
        dVar2 = *pdVar6;
        if (-*(double *)(this + lVar10 * 8 + 0x40) <= dVar2) {
          if (*(double *)(this + lVar10 * 8 + 0x40) <= dVar2) {
            dVar2 = dVar2 - *(double *)(this + lVar10 * 8 + 0x30);
            goto LAB_0010b770;
          }
        }
        else {
          dVar2 = dVar2 + *(double *)(this + lVar10 * 8 + 0x30);
LAB_0010b770:
          *pdVar6 = dVar2;
        }
        lVar10 = 1;
        pdVar6 = &local_78;
        bVar5 = false;
      } while (bVar4);
      bVar5 = true;
      lVar10 = 0;
      pdVar6 = &local_70;
      do {
        dVar2 = *pdVar6;
        dVar12 = (ppVar1->values_).elems[lVar10] + *(double *)(lVar8 + 0x58 + lVar10 * 8);
        if (!bVar5) break;
        lVar10 = 1;
        bVar5 = false;
        pdVar6 = &local_78;
      } while (ABS(dVar2) <= dVar12);
      if (ABS(dVar2) <= dVar12) {
        local_58.rect.center.values_.elems[0] = (q->rect).center.values_.elems[0];
        local_58.rect.center.values_.elems[1] = (q->rect).center.values_.elems[1];
        local_58.rect.radius.values_.elems[0] = (ppVar1->values_).elems[0];
        local_58.rect.radius.values_.elems[1] = (q->rect).radius.values_.elems[1];
        query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
                  (this,node_idx_00,&local_58,local_68);
        puVar9 = local_60;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar9);
  }
  return;
}

Assistant:

void query_impl(std::size_t node_idx, Query q, OutputIterator out) const
    {
        const node_type& node = tree_.at(node_idx);
        if(node.is_leaf)
        {
            for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                value_type const& val = container_.at(*i);
                if(q.match(indexable_getter_(val), this->boundary_) && q.match(val))
                {
                    *out = val;
                    ++out;
                }
            }
        }
        else
        {
            for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const std::size_t next = *i;
                if(intersects(q.box(), tree_.at(next).box, this->boundary_))
                {
                    this->query_impl(next, q, out);
                }
            }
        }
        return;
    }